

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  ImDrawChannel *pIVar3;
  bool bVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  ulong uVar11;
  ImDrawCmd *pIVar12;
  long lVar13;
  ImDrawCmd *pIVar14;
  uint *puVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  iVar17 = 0;
  SetCurrentChannel(this,draw_list,0);
  uVar10 = (draw_list->CmdBuffer).Size;
  if (0 < (int)uVar10) {
    pIVar14 = (draw_list->CmdBuffer).Data;
    uVar23 = uVar10;
    do {
      uVar10 = uVar23;
      if ((pIVar14[(ulong)uVar23 - 1].ElemCount != 0) ||
         (pIVar14[(ulong)uVar23 - 1].UserCallback != (ImDrawCallback)0x0)) break;
      uVar10 = uVar23 - 1;
      (draw_list->CmdBuffer).Size = uVar10;
      bVar4 = 1 < (int)uVar23;
      uVar23 = uVar10;
    } while (bVar4);
  }
  if (this->_Count < 1) {
    iVar16 = 0;
  }
  else {
    iVar17 = 0;
    if ((int)uVar10 < 1) {
LAB_0019b596:
      pIVar12 = (ImDrawCmd *)0x0;
      uVar23 = 0;
    }
    else {
      pIVar14 = (draw_list->CmdBuffer).Data;
      pIVar12 = pIVar14 + ((ulong)uVar10 - 1);
      if (pIVar12 == (ImDrawCmd *)0x0) goto LAB_0019b596;
      uVar23 = pIVar14[(ulong)uVar10 - 1].ElemCount + pIVar14[(ulong)uVar10 - 1].IdxOffset;
    }
    iVar16 = 0;
    if (this->_Count != 1) {
      iVar16 = 0;
      lVar21 = 1;
      iVar17 = 0;
      do {
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar21;
        iVar18 = pIVar2[lVar21]._CmdBuffer.Size;
        uVar11 = (ulong)iVar18;
        if ((long)uVar11 < 1) {
LAB_0019b695:
          iVar20 = (pIVar3->_IdxBuffer).Size;
        }
        else {
          pIVar14 = (pIVar3->_CmdBuffer).Data;
          if ((pIVar14[uVar11 - 1].ElemCount == 0) &&
             (pIVar14[uVar11 - 1].UserCallback == (ImDrawCallback)0x0)) {
            uVar11 = (ulong)(iVar18 - 1U);
            (pIVar3->_CmdBuffer).Size = iVar18 - 1U;
          }
          if (((int)uVar11 == 0) || (pIVar12 == (ImDrawCmd *)0x0)) {
LAB_0019b665:
            iVar18 = (int)uVar11;
            if (iVar18 < 1) goto LAB_0019b695;
          }
          else {
            pIVar14 = (pIVar3->_CmdBuffer).Data;
            auVar26[0] = -(*(char *)&(pIVar14->ClipRect).x == *(char *)&(pIVar12->ClipRect).x);
            auVar26[1] = -(*(char *)((long)&(pIVar14->ClipRect).x + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).x + 1));
            auVar26[2] = -(*(char *)((long)&(pIVar14->ClipRect).x + 2) ==
                          *(char *)((long)&(pIVar12->ClipRect).x + 2));
            auVar26[3] = -(*(char *)((long)&(pIVar14->ClipRect).x + 3) ==
                          *(char *)((long)&(pIVar12->ClipRect).x + 3));
            auVar26[4] = -(*(char *)&(pIVar14->ClipRect).y == *(char *)&(pIVar12->ClipRect).y);
            auVar26[5] = -(*(char *)((long)&(pIVar14->ClipRect).y + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).y + 1));
            auVar26[6] = -(*(char *)((long)&(pIVar14->ClipRect).y + 2) ==
                          *(char *)((long)&(pIVar12->ClipRect).y + 2));
            auVar26[7] = -(*(char *)((long)&(pIVar14->ClipRect).y + 3) ==
                          *(char *)((long)&(pIVar12->ClipRect).y + 3));
            auVar26[8] = -(*(char *)&(pIVar14->ClipRect).z == *(char *)&(pIVar12->ClipRect).z);
            auVar26[9] = -(*(char *)((long)&(pIVar14->ClipRect).z + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).z + 1));
            auVar26[10] = -(*(char *)((long)&(pIVar14->ClipRect).z + 2) ==
                           *(char *)((long)&(pIVar12->ClipRect).z + 2));
            auVar26[0xb] = -(*(char *)((long)&(pIVar14->ClipRect).z + 3) ==
                            *(char *)((long)&(pIVar12->ClipRect).z + 3));
            auVar26[0xc] = -(*(char *)&(pIVar14->ClipRect).w == *(char *)&(pIVar12->ClipRect).w);
            auVar26[0xd] = -(*(char *)((long)&(pIVar14->ClipRect).w + 1) ==
                            *(char *)((long)&(pIVar12->ClipRect).w + 1));
            auVar26[0xe] = -(*(char *)((long)&(pIVar14->ClipRect).w + 2) ==
                            *(char *)((long)&(pIVar12->ClipRect).w + 2));
            auVar26[0xf] = -(*(char *)((long)&(pIVar14->ClipRect).w + 3) ==
                            *(char *)((long)&(pIVar12->ClipRect).w + 3));
            auVar24[0] = -(*(char *)&(pIVar14->ClipRect).w == *(char *)&(pIVar12->ClipRect).w);
            auVar24[1] = -(*(char *)((long)&(pIVar14->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).w + 1));
            auVar24[2] = -(*(char *)((long)&(pIVar14->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar12->ClipRect).w + 2));
            auVar24[3] = -(*(char *)((long)&(pIVar14->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar12->ClipRect).w + 3));
            auVar24[4] = -(*(char *)&pIVar14->TextureId == *(char *)&pIVar12->TextureId);
            auVar24[5] = -(*(char *)((long)&pIVar14->TextureId + 1) ==
                          *(char *)((long)&pIVar12->TextureId + 1));
            auVar24[6] = -(*(char *)((long)&pIVar14->TextureId + 2) ==
                          *(char *)((long)&pIVar12->TextureId + 2));
            auVar24[7] = -(*(char *)((long)&pIVar14->TextureId + 3) ==
                          *(char *)((long)&pIVar12->TextureId + 3));
            auVar24[8] = -(*(char *)((long)&pIVar14->TextureId + 4) ==
                          *(char *)((long)&pIVar12->TextureId + 4));
            auVar24[9] = -(*(char *)((long)&pIVar14->TextureId + 5) ==
                          *(char *)((long)&pIVar12->TextureId + 5));
            auVar24[10] = -(*(char *)((long)&pIVar14->TextureId + 6) ==
                           *(char *)((long)&pIVar12->TextureId + 6));
            auVar24[0xb] = -(*(char *)((long)&pIVar14->TextureId + 7) ==
                            *(char *)((long)&pIVar12->TextureId + 7));
            auVar24[0xc] = -((char)pIVar14->VtxOffset == (char)pIVar12->VtxOffset);
            auVar24[0xd] = -(*(char *)((long)&pIVar14->VtxOffset + 1) ==
                            *(char *)((long)&pIVar12->VtxOffset + 1));
            auVar24[0xe] = -(*(char *)((long)&pIVar14->VtxOffset + 2) ==
                            *(char *)((long)&pIVar12->VtxOffset + 2));
            auVar24[0xf] = -(*(char *)((long)&pIVar14->VtxOffset + 3) ==
                            *(char *)((long)&pIVar12->VtxOffset + 3));
            auVar24 = auVar24 & auVar26;
            if (((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) &&
               (pIVar14->UserCallback == (ImDrawCallback)0x0 &&
                pIVar12->UserCallback == (ImDrawCallback)0x0)) {
              pIVar12->ElemCount = pIVar12->ElemCount + pIVar14->ElemCount;
              uVar23 = uVar23 + pIVar14->ElemCount;
              memmove(pIVar14,pIVar14 + 1,(uVar11 & 0xffffffff) * 0x38 - 0x38);
              uVar10 = (pIVar3->_CmdBuffer).Size - 1;
              uVar11 = (ulong)uVar10;
              (pIVar3->_CmdBuffer).Size = uVar10;
              goto LAB_0019b665;
            }
          }
          pIVar14 = (pIVar3->_CmdBuffer).Data;
          iVar18 = (int)uVar11;
          uVar11 = uVar11 & 0xffffffff;
          pIVar12 = pIVar14 + (uVar11 - 1);
          iVar20 = (pIVar3->_IdxBuffer).Size;
          puVar15 = &pIVar14->ElemCount;
          do {
            puVar15[-1] = uVar23;
            uVar23 = uVar23 + *puVar15;
            puVar15 = puVar15 + 0xe;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        iVar17 = iVar17 + iVar20;
        iVar16 = iVar16 + iVar18;
        lVar21 = lVar21 + 1;
      } while (lVar21 < this->_Count);
      uVar10 = (draw_list->CmdBuffer).Size;
    }
  }
  iVar20 = uVar10 + iVar16;
  iVar18 = (draw_list->CmdBuffer).Capacity;
  if (iVar18 < iVar20) {
    if (iVar18 == 0) {
      iVar18 = 8;
    }
    else {
      iVar18 = iVar18 / 2 + iVar18;
    }
    if (iVar18 <= iVar20) {
      iVar18 = iVar20;
    }
    pIVar12 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar18 * 0x38);
    pIVar14 = (draw_list->CmdBuffer).Data;
    if (pIVar14 != (ImDrawCmd *)0x0) {
      memcpy(pIVar12,pIVar14,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar12;
    (draw_list->CmdBuffer).Capacity = iVar18;
  }
  (draw_list->CmdBuffer).Size = iVar20;
  lVar21 = (long)(draw_list->IdxBuffer).Size + (long)iVar17;
  iVar18 = (draw_list->IdxBuffer).Capacity;
  iVar19 = (int)lVar21;
  if (iVar18 < iVar19) {
    if (iVar18 == 0) {
      iVar18 = 8;
    }
    else {
      iVar18 = iVar18 / 2 + iVar18;
    }
    if (iVar18 <= iVar19) {
      iVar18 = iVar19;
    }
    local_40 = (uint *)ImGui::MemAlloc((long)iVar18 << 2);
    puVar15 = (draw_list->IdxBuffer).Data;
    if (puVar15 != (uint *)0x0) {
      memcpy(local_40,puVar15,(long)(draw_list->IdxBuffer).Size << 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = iVar18;
    iVar20 = (draw_list->CmdBuffer).Size;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = iVar19;
  local_40 = local_40 + (lVar21 - iVar17);
  if (1 < this->_Count) {
    pIVar14 = (draw_list->CmdBuffer).Data + ((long)iVar20 - (long)iVar16);
    lVar22 = 1;
    lVar21 = 0x38;
    do {
      pIVar3 = (this->_Channels).Data;
      lVar13 = (long)*(int *)((long)pIVar3 + lVar21 + -0x18);
      if (lVar13 != 0) {
        memcpy(pIVar14,*(void **)((long)pIVar3 + lVar21 + -0x10),lVar13 * 0x38);
        pIVar14 = pIVar14 + lVar13;
      }
      lVar13 = (long)*(int *)((long)pIVar3 + lVar21 + -8);
      if (lVar13 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar21),lVar13 * 4);
        local_40 = local_40 + lVar13;
      }
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x20;
    } while (lVar22 < this->_Count);
    iVar20 = (draw_list->CmdBuffer).Size;
  }
  draw_list->_IdxWritePtr = local_40;
  if (iVar20 != 0) {
    pIVar14 = (draw_list->CmdBuffer).Data;
    lVar21 = (long)iVar20;
    if (pIVar14[lVar21 + -1].UserCallback == (ImDrawCallback)0x0) goto LAB_0019b89b;
  }
  ImDrawList::AddDrawCmd(draw_list);
  pIVar14 = (draw_list->CmdBuffer).Data;
  lVar21 = (long)(draw_list->CmdBuffer).Size;
LAB_0019b89b:
  pIVar12 = pIVar14 + lVar21 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar14[lVar21 + -1].ElemCount == 0) {
    fVar6 = (pIVar1->ClipRect).x;
    fVar7 = (pIVar1->ClipRect).y;
    fVar8 = (draw_list->_CmdHeader).ClipRect.z;
    fVar9 = (draw_list->_CmdHeader).ClipRect.w;
    uVar5 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar14[lVar21 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar14[lVar21 + -1].TextureId + 4) = uVar5;
    (pIVar12->ClipRect).x = fVar6;
    (pIVar12->ClipRect).y = fVar7;
    pIVar14[lVar21 + -1].ClipRect.z = fVar8;
    pIVar14[lVar21 + -1].ClipRect.w = fVar9;
  }
  else {
    auVar27[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar12->ClipRect).x);
    auVar27[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.x + 1));
    auVar27[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.x + 2));
    auVar27[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.x + 3));
    auVar27[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                  *(char *)&pIVar14[lVar21 + -1].ClipRect.y);
    auVar27[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.y + 1));
    auVar27[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.y + 2));
    auVar27[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.y + 3));
    auVar27[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                  *(char *)&pIVar14[lVar21 + -1].ClipRect.z);
    auVar27[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.z + 1));
    auVar27[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.z + 2));
    auVar27[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.z + 3));
    auVar27[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar14[lVar21 + -1].ClipRect.w);
    auVar27[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.w + 1));
    auVar27[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.w + 2));
    auVar27[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.w + 3));
    auVar25[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                  *(char *)&pIVar14[lVar21 + -1].ClipRect.w);
    auVar25[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.w + 1));
    auVar25[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.w + 2));
    auVar25[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].ClipRect.w + 3));
    auVar25[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                  *(char *)&pIVar14[lVar21 + -1].TextureId);
    auVar25[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].TextureId + 1));
    auVar25[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].TextureId + 2));
    auVar25[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].TextureId + 3));
    auVar25[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].TextureId + 4));
    auVar25[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar14[lVar21 + -1].TextureId + 5));
    auVar25[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar14[lVar21 + -1].TextureId + 6));
    auVar25[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].TextureId + 7));
    auVar25[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset == (char)pIVar14[lVar21 + -1].VtxOffset
                    );
    auVar25[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].VtxOffset + 1));
    auVar25[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].VtxOffset + 2));
    auVar25[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar14[lVar21 + -1].VtxOffset + 3));
    auVar25 = auVar25 & auVar27;
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0 && ch._CmdBuffer.back().UserCallback == NULL) // Equivalent of PopUnusedDrawCmd()
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            // Do not include ImDrawCmd_AreSequentialIdxOffset() in the compare as we rebuild IdxOffset values ourselves.
            // Manipulating IdxOffset (e.g. by reordering draw commands like done by RenderDimmedBackgroundBehindWindow()) is not supported within a splitter.
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}